

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O3

lws_mqtt_str_t * lws_mqtt_str_create(uint16_t lim)

{
  lws_mqtt_str_t *plVar1;
  undefined6 in_register_0000003a;
  
  plVar1 = (lws_mqtt_str_t *)
           lws_realloc((void *)0x0,(CONCAT62(in_register_0000003a,lim) & 0xffffffff) + 0x11,
                       "lws_mqtt_str_create");
  if (plVar1 != (lws_mqtt_str_t *)0x0) {
    plVar1->len = 0;
    plVar1->pos = 0;
    plVar1->len_valid = '\0';
    plVar1->needs_freeing = '\x01';
    plVar1->buf = (uint8_t *)(plVar1 + 1);
    plVar1->limit = lim;
  }
  return plVar1;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create(uint16_t lim)
{
	lws_mqtt_str_t *s = lws_malloc(sizeof(*s) + lim + 1, __func__);

	if (!s)
		return NULL;

	s->len = 0;
	s->pos = 0;
	s->buf = (uint8_t *)&s[1];
	s->limit = lim;
	s->len_valid = 0;
	s->needs_freeing = 1;

	return s;
}